

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsBegin,
          DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsEnd)

{
  bool bVar1;
  DBKeyID *pDVar2;
  DBKeyID *pDVar3;
  KeyID *pKVar4;
  KeyID *pKVar5;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDStack_48;
  bool FoundVal;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *DestBucket;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *E;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *B;
  DBKeyID TombstoneKey;
  DBKeyID EmptyKey;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsEnd_local;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  initEmpty(this);
  TombstoneKey = getEmptyKey();
  B = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)getTombstoneKey();
  DestBucket = OldBucketsEnd;
  E = OldBucketsBegin;
  do {
    if (E == DestBucket) {
      return;
    }
    pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
    bVar1 = DenseMapInfo<DBKeyID>::isEqual(pDVar2,&TombstoneKey);
    if (!bVar1) {
      pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
      bVar1 = DenseMapInfo<DBKeyID>::isEqual(pDVar2,(DBKeyID *)&B);
      if (!bVar1) {
        pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
        bVar1 = LookupBucketFor<DBKeyID>(this,pDVar2,&stack0xffffffffffffffb8);
        if (bVar1) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>]"
                       );
        }
        pDVar2 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
        pDVar3 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(pDStack_48);
        pDVar3->value = pDVar2->value;
        pKVar4 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getSecond(pDStack_48);
        pKVar5 = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getSecond(E);
        pKVar4->_value = pKVar5->_value;
        incrementNumEntries(this);
        detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getSecond(E);
      }
    }
    detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }